

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::GeneratePlotFile
          (ChISO2631_Vibration_SeatCushionLogger *this,string *fName,string *testInfo)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  ofstream plt;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  undefined1 auVar4 [16];
  
  std::ofstream::ofstream(&local_230,(string *)fName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ChISO2631_SeatCushionLogger: Connot generate file \'",0x33);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fName->_M_dataplus)._M_p,fName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\', bailing out!",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"$ALLDATA << EOD",0xf);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    auVar4._8_8_ = extraout_XMM1_Qb;
    auVar4._0_8_ = extraout_XMM1_Qa;
    if ((this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        auVar4 = vcvtusi2sd_avx512f(auVar4,uVar3);
        poVar2 = std::ostream::_M_insert<double>(auVar4._0_8_ * this->m_step);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_x_wd).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_y_wd).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_acc_z_wk).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_x_i).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_y_i).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_z_i).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_x_avg).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_y_avg).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->m_data_aw_z_avg).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        auVar4._8_8_ = extraout_XMM1_Qb_00;
        auVar4._0_8_ = extraout_XMM1_Qa_00;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)(this->m_data_acc_x).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->m_data_acc_x).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"EOD",3);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set title \'ISO2631 Vibration Test: ",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(testInfo->_M_dataplus)._M_p,
                        testInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set xlabel \'Time [s]\'",0x15);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set ylabel \'A [m/s^2]\'",0x16);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"plot $ALLDATA u 1:2  t \'Ax\' with lines, \\",0x29);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:3  t \'Ay\' with lines, \\",0x29);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:4  t \'Az\' with lines",0x26);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"pause -1",8);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set title \'ISO2631 Vibration Test: ",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(testInfo->_M_dataplus)._M_p,
                        testInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set xlabel \'Time [s]\'",0x15);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set ylabel \'AW [m/s^2]\'",0x17);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"plot $ALLDATA u 1:5  t \'AWx\' with lines, \\",0x2a);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:6  t \'AWy\' with lines, \\",0x2a);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:7  t \'AWz\' with lines",0x27);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"pause -1",8);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set title \'ISO2631 Vibration Test: ",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(testInfo->_M_dataplus)._M_p,
                        testInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set xlabel \'Time [s]\'",0x15);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set ylabel \'AWi [m/s^2]\'",0x18);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"plot $ALLDATA u 1:8  t \'AWxi\' with lines, \\",0x2b);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:9  t \'AWyi\' with lines, \\",0x2b);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:10  t \'AWzi\' with lines",0x29);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"pause -1",8);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set title \'ISO2631 Vibration Test: ",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(testInfo->_M_dataplus)._M_p,
                        testInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set xlabel \'Time [s]\'",0x15);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"set ylabel \'AWavg [m/s^2]\'",0x1a);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"plot $ALLDATA u 1:11  t \'AWxavg\' with lines, \\",0x2e);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:12  t \'AWyavg\' with lines, \\",0x2e);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"     $ALLDATA u 1:13  t \'AWzavz\' with lines",0x2b);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ChISO2631_Vibration_SeatCushionLogger::GeneratePlotFile(std::string fName, std::string testInfo) {
    std::ofstream plt(fName);
    if (!plt.is_open()) {
        std::cout << "ChISO2631_SeatCushionLogger: Connot generate file '" << fName << "', bailing out!" << std::endl;
        return;
    }
    plt << "$ALLDATA << EOD" << std::endl;
    for (size_t i = 0; i < m_data_acc_x.size(); i++) {
        double t = m_step * i;
        plt << t << "\t" << m_data_acc_x[i] << "\t" << m_data_acc_y[i] << "\t" << m_data_acc_z[i] << "\t"
            << m_data_acc_x_wd[i] << "\t" << m_data_acc_y_wd[i] << "\t" << m_data_acc_z_wk[i] << "\t"
            << m_data_aw_x_i[i] << "\t" << m_data_aw_y_i[i] << "\t" << m_data_aw_z_i[i] << "\t" << m_data_aw_x_avg[i]
            << "\t" << m_data_aw_y_avg[i] << "\t" << m_data_aw_z_avg[i] << std::endl;
    }
    plt << "EOD" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'A [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:2  t 'Ax' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:3  t 'Ay' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:4  t 'Az' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AW [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:5  t 'AWx' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:6  t 'AWy' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:7  t 'AWz' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AWi [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:8  t 'AWxi' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:9  t 'AWyi' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:10  t 'AWzi' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AWavg [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:11  t 'AWxavg' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:12  t 'AWyavg' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:13  t 'AWzavz' with lines" << std::endl;
    plt.close();
}